

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

void __thiscall BackwardPass::UpdateArrayValueTypes(BackwardPass *this,Instr *instr,Opnd *origOpnd)

{
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  byte bVar4;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  ValueType VVar9;
  undefined4 *puVar10;
  StackSym *pSVar11;
  BVSparse<Memory::JitArenaAllocator> *pBVar12;
  BVSparse<Memory::JitArenaAllocator> *pBVar13;
  Opnd *pOVar14;
  RegOpnd *pRVar15;
  ArrayRegOpnd *this_00;
  StackSym *pSVar16;
  Instr *pIVar17;
  IndirOpnd *this_01;
  byte bVar18;
  char *IsCheckedUse;
  bool bVar19;
  bool bVar20;
  Instr **in_R8;
  bool bVar21;
  Instr *pIVar22;
  Instr *local_58;
  ArrayRegOpnd *arrayOpnd;
  byte bStack_48;
  undefined7 uStack_47;
  ValueType checkedSrcValueType;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType valueType;
  
  if (this->tag != DeadStorePhase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1372,"(tag == Js::DeadStorePhase)","tag == Js::DeadStorePhase");
    if (!bVar2) goto LAB_003e91f6;
    *puVar10 = 0;
  }
  if (this->currentPrePassLoop != (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1373,"(!IsPrePass())","!IsPrePass()");
    if (!bVar2) goto LAB_003e91f6;
    *puVar10 = 0;
  }
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1374,"(instr)","instr");
    if (!bVar2) goto LAB_003e91f6;
    *puVar10 = 0;
  }
  if (origOpnd == (Opnd *)0x0) {
    return;
  }
  if ((instr->m_opcode & ~ExtendedOpcodePrefix) == StElemC) {
    return;
  }
  OVar3 = IR::Opnd::GetKind(origOpnd);
  pIVar17 = (Instr *)origOpnd;
  if (OVar3 == OpndKindSym) {
    OVar3 = IR::Opnd::GetKind(origOpnd);
    if (OVar3 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar2) goto LAB_003e91f6;
      *puVar10 = 0;
    }
    if (*(char *)((long)origOpnd[1]._vptr_Opnd + 0x14) != '\x02') {
      return;
    }
    pIVar22 = (Instr *)0x0;
  }
  else {
    if (OVar3 != OpndKindReg) {
      if (OVar3 != OpndKindIndir) {
        return;
      }
      OVar3 = IR::Opnd::GetKind(origOpnd);
      if (OVar3 != OpndKindIndir) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
        if (!bVar2) goto LAB_003e91f6;
        *puVar10 = 0;
      }
      pIVar17 = (Instr *)origOpnd[1]._vptr_Opnd;
    }
    OVar3 = IR::Opnd::GetKind((Opnd *)pIVar17);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar2) goto LAB_003e91f6;
      *puVar10 = 0;
    }
    bVar2 = IR::RegOpnd::IsArrayRegOpnd((RegOpnd *)pIVar17);
    if (bVar2) {
      bVar2 = IR::RegOpnd::IsArrayRegOpnd((RegOpnd *)pIVar17);
      pIVar22 = pIVar17;
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x24d,"(IsArrayRegOpnd())","IsArrayRegOpnd()");
        if (!bVar2) goto LAB_003e91f6;
        *puVar10 = 0;
      }
    }
    else {
      pIVar22 = (Instr *)0x0;
    }
  }
  local_32[0] = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&pIVar17->m_noLazyHelperAssert;
  local_58 = pIVar22;
  bVar2 = ValueType::IsAnyOptimizedArray((ValueType *)&local_32[0].field_0);
  if (!bVar2) {
    return;
  }
  bVar4 = ValueType::IsArrayOrObjectWithArray((ValueType *)&local_32[0].field_0);
  bVar2 = ValueType::IsOptimizedTypedArray((ValueType *)&local_32[0].field_0);
  _bStack_48 = (Opnd *)CONCAT71(uStack_47,bVar4);
  if ((bool)bVar4 == bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x13aa,"(!isJsArray == valueType.IsOptimizedTypedArray())",
                       "!isJsArray == valueType.IsOptimizedTypedArray()");
    if (!bVar2) goto LAB_003e91f6;
    *puVar10 = 0;
    bVar4 = bStack_48;
  }
  pBVar12 = this->currentBlock->noImplicitCallUses;
  do {
    pBVar12 = (BVSparse<Memory::JitArenaAllocator> *)pBVar12->head;
    if (pBVar12 == (BVSparse<Memory::JitArenaAllocator> *)0x0) break;
  } while (((Type *)&pBVar12->alloc)->word == 0);
  if (bVar4 == 0) {
    bVar18 = 0;
LAB_003e8bfa:
    bVar2 = false;
  }
  else {
    bVar18 = (pIVar17->field_0xb ^ 1) & pBVar12 == (BVSparse<Memory::JitArenaAllocator> *)0x0;
    if ((pIVar17->field_0xb & 1) != 0) goto LAB_003e8bfa;
    bVar2 = ValueType::HasVarElements((ValueType *)&local_32[0].field_0);
    bVar4 = bStack_48;
    if (bVar2) {
      bVar2 = false;
    }
    else {
      pBVar13 = this->currentBlock->noImplicitCallNativeArrayUses;
      do {
        pBVar13 = (BVSparse<Memory::JitArenaAllocator> *)pBVar13->head;
        bVar2 = pBVar13 == (BVSparse<Memory::JitArenaAllocator> *)0x0;
        if (bVar2) break;
      } while (((Type *)&pBVar13->alloc)->word == 0);
    }
  }
  if ((bVar4 == 0) || ((pIVar17->field_0xb & 1) != 0)) {
    bVar21 = false;
  }
  else {
    bVar21 = ValueType::HasNoMissingValues((ValueType *)&local_32[0].field_0);
    bVar4 = bStack_48;
    if (bVar21) {
      pBVar13 = this->currentBlock->noImplicitCallNoMissingValuesUses;
      do {
        pBVar13 = (BVSparse<Memory::JitArenaAllocator> *)pBVar13->head;
        bVar21 = pBVar13 == (BVSparse<Memory::JitArenaAllocator> *)0x0;
        if (bVar21) break;
      } while (((Type *)&pBVar13->alloc)->word == 0);
    }
    else {
      bVar21 = false;
    }
  }
  pBVar13 = this->currentBlock->noImplicitCallJsArrayHeadSegmentSymUses;
  do {
    pBVar13 = (BVSparse<Memory::JitArenaAllocator> *)pBVar13->head;
    if (pBVar13 == (BVSparse<Memory::JitArenaAllocator> *)0x0) break;
  } while (((Type *)&pBVar13->alloc)->word == 0);
  bVar5 = pIVar22 != (Instr *)0x0 & bVar4;
  if (bVar5 == 1) {
    bVar19 = pIVar22->m_func != (Func *)0x0 && pBVar13 == (BVSparse<Memory::JitArenaAllocator> *)0x0
    ;
  }
  else {
    bVar19 = false;
  }
  if (pIVar22 == (Instr *)0x0) {
    bVar20 = false;
  }
  else {
    if (bVar4 != 0) {
      pBVar12 = pBVar13;
    }
    bVar20 = pBVar12 == (BVSparse<Memory::JitArenaAllocator> *)0x0 &&
             pIVar22->globOptInstrString != (char16 *)0x0;
  }
  if (bVar5 != 0) {
    pSVar11 = IR::ArrayRegOpnd::LengthSym((ArrayRegOpnd *)pIVar22);
    bVar4 = bStack_48;
    if (pSVar11 != (StackSym *)0x0) {
      bVar6 = ValueType::IsArray((ValueType *)&local_32[0].field_0);
      bVar4 = bStack_48;
      if (!bVar6) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x13be,
                           "(!isJsArray || !arrayOpnd || !arrayOpnd->LengthSym() || valueType.IsArray())"
                           ,
                           "!isJsArray || !arrayOpnd || !arrayOpnd->LengthSym() || valueType.IsArray()"
                          );
        if (!bVar6) goto LAB_003e91f6;
        *puVar10 = 0;
        bVar4 = bStack_48;
      }
    }
  }
  pIVar22 = local_58;
  if ((local_58 != (Instr *)0x0 & bVar4) == 1) {
    pSVar11 = IR::ArrayRegOpnd::LengthSym((ArrayRegOpnd *)local_58);
    bVar4 = bStack_48;
    if (pSVar11 == (StackSym *)0x0) {
      bVar6 = false;
    }
    else {
      pBVar12 = this->currentBlock->noImplicitCallArrayLengthSymUses;
      do {
        pBVar12 = (BVSparse<Memory::JitArenaAllocator> *)pBVar12->head;
        bVar6 = pBVar12 == (BVSparse<Memory::JitArenaAllocator> *)0x0;
        if (bVar6) break;
      } while (((Type *)&pBVar12->alloc)->word == 0);
    }
  }
  else {
    bVar6 = false;
  }
  if ((byte)(bVar2 | bVar19 | bVar18 | bVar21 | bVar20) == 1) {
    if (pIVar17 != (Instr *)instr->m_dst) {
      if (bVar4 == 0) {
        IsCheckedUse = (char *)pIVar17;
        if (bVar20 == false) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          _bStack_48 = (Opnd *)__tls_get_addr(&PTR_0155fe48);
          *(undefined4 *)&_bStack_48->_vptr_Opnd = 1;
          IsCheckedUse = "removeHeadSegmentLengthSym";
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x140e,"(removeHeadSegmentLengthSym)","removeHeadSegmentLengthSym");
          if (!bVar7) goto LAB_003e91f6;
          *(undefined4 *)&_bStack_48->_vptr_Opnd = 0;
        }
        pOVar14 = FindNoImplicitCallUse<BackwardPass::UpdateArrayValueTypes(IR::Instr*,IR::Opnd*)::__1>
                            ((BackwardPass *)instr,(Instr *)pIVar22->globOptInstrString,
                             (StackSym *)&local_58,(anon_class_8_1_c0a7bff0)IsCheckedUse,in_R8);
        bVar20 = (bool)(bVar20 & pOVar14 == (Opnd *)0x0);
      }
      else {
        pOVar14 = FindNoImplicitCallUse<BackwardPass::UpdateArrayValueTypes(IR::Instr*,IR::Opnd*)::__0>
                            ((BackwardPass *)instr,pIVar17,(Opnd *)&local_32[0].field_0,
                             (anon_class_8_1_e7f4faeb)pIVar17,in_R8);
        if (pOVar14 != (Opnd *)0x0) {
          arrayOpnd._6_2_ = (pOVar14->m_valueType).field_0;
          _bStack_48 = pOVar14;
          if ((bVar2 != false) &&
             (bVar7 = ValueType::HasVarElements((ValueType *)((long)&arrayOpnd + 6)), !bVar7)) {
            bVar7 = ValueType::HasIntElements((ValueType *)((long)&arrayOpnd + 6));
            bVar8 = ValueType::HasIntElements((ValueType *)&local_32[0].field_0);
            bVar2 = (bool)(bVar2 & bVar8 != bVar7);
          }
          if (bVar21 != false) {
            bVar7 = ValueType::HasNoMissingValues((ValueType *)((long)&arrayOpnd + 6));
            bVar21 = (bool)(bVar21 & !bVar7);
          }
          pOVar14 = _bStack_48;
          if (((byte)(bVar19 | bVar20 | bVar6) == 1) &&
             (OVar3 = IR::Opnd::GetKind(_bStack_48), OVar3 == OpndKindReg)) {
            pRVar15 = IR::Opnd::AsRegOpnd(pOVar14);
            bVar7 = IR::RegOpnd::IsArrayRegOpnd(pRVar15);
            if (bVar7) {
              pRVar15 = IR::Opnd::AsRegOpnd(pOVar14);
              this_00 = IR::RegOpnd::AsArrayRegOpnd(pRVar15);
              if (bVar19 != false) {
                bVar19 = (bool)((Func *)this_00->headSegmentSym != local_58->m_func & bVar19);
              }
              if (bVar20 != false) {
                bVar20 = (bool)(this_00->headSegmentLengthSym !=
                                (StackSym *)local_58->globOptInstrString & bVar20);
              }
              if (bVar6 != false) {
                pSVar11 = IR::ArrayRegOpnd::LengthSym(this_00);
                pSVar16 = IR::ArrayRegOpnd::LengthSym((ArrayRegOpnd *)local_58);
                bVar6 = (bool)(bVar6 & pSVar11 != pSVar16);
              }
            }
          }
          bVar18 = 0;
        }
      }
    }
    pIVar22 = local_58;
    if ((bVar2 != false) || (bVar18 != 0)) {
      if (local_58 != (Instr *)0x0) {
        pIVar17 = (Instr *)IR::ArrayRegOpnd::CopyAsRegOpnd((ArrayRegOpnd *)local_58,instr->m_func);
        OVar3 = IR::Opnd::GetKind(origOpnd);
        if (OVar3 == OpndKindIndir) {
          this_01 = IR::Opnd::AsIndirOpnd(origOpnd);
          pRVar15 = IR::Opnd::AsRegOpnd((Opnd *)pIVar17);
          IR::IndirOpnd::ReplaceBaseOpnd(this_01,pRVar15);
        }
        else {
          IR::Instr::Replace(instr,(Opnd *)pIVar22,(Opnd *)pIVar17);
        }
        local_58 = (Instr *)0x0;
      }
      VVar9 = ValueType::ToLikely((ValueType *)&local_32[0].field_0);
      IR::Opnd::SetValueType((Opnd *)pIVar17,VVar9);
      return;
    }
    if (bVar21 != false) {
      VVar9 = ValueType::SetHasNoMissingValues((ValueType *)&local_32[0].field_0,false);
      IR::Opnd::SetValueType((Opnd *)pIVar17,VVar9);
    }
    pIVar17 = local_58;
    if (bVar19 != false) {
      if (local_58 == (Instr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x143e,"(arrayOpnd)","arrayOpnd");
        if (!bVar2) goto LAB_003e91f6;
        *puVar10 = 0;
      }
      pIVar17->m_func = (Func *)0x0;
    }
    pIVar17 = local_58;
    if (bVar20 != false) {
      if (local_58 == (Instr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1443,"(arrayOpnd)","arrayOpnd");
        if (!bVar2) goto LAB_003e91f6;
        *puVar10 = 0;
      }
      pIVar17->globOptInstrString = (char16 *)0x0;
    }
    pIVar17 = local_58;
    if (bVar6 != false) {
      if (local_58 == (Instr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1448,"(arrayOpnd)","arrayOpnd");
        if (!bVar2) {
LAB_003e91f6:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar10 = 0;
      }
      IR::ArrayRegOpnd::RemoveLengthSym((ArrayRegOpnd *)pIVar17);
    }
  }
  return;
}

Assistant:

void
BackwardPass::UpdateArrayValueTypes(IR::Instr *const instr, IR::Opnd *origOpnd)
{
    Assert(tag == Js::DeadStorePhase);
    Assert(!IsPrePass());
    Assert(instr);

    if(!origOpnd)
    {
        return;
    }

    IR::Instr *opndOwnerInstr = instr;
    switch(instr->m_opcode)
    {
        case Js::OpCode::StElemC:
        case Js::OpCode::StArrSegElemC:
            // These may not be fixed if we are unsure about the type of the array they're storing to
            // (because it relies on profile data) and we weren't able to hoist the array check.
            return;
    }

    Sym *sym;
    IR::Opnd* opnd = origOpnd;
    IR::ArrayRegOpnd *arrayOpnd;
    switch(opnd->GetKind())
    {
        case IR::OpndKindIndir:
            opnd = opnd->AsIndirOpnd()->GetBaseOpnd();
            // fall-through

        case IR::OpndKindReg:
        {
            IR::RegOpnd *const regOpnd = opnd->AsRegOpnd();
            sym = regOpnd->m_sym;
            arrayOpnd = regOpnd->IsArrayRegOpnd() ? regOpnd->AsArrayRegOpnd() : nullptr;
            break;
        }

        case IR::OpndKindSym:
            sym = opnd->AsSymOpnd()->m_sym;
            if(!sym->IsPropertySym())
            {
                return;
            }
            arrayOpnd = nullptr;
            break;

        default:
            return;
    }

    const ValueType valueType(opnd->GetValueType());
    if(!valueType.IsAnyOptimizedArray())
    {
        return;
    }

    const bool isJsArray = valueType.IsArrayOrObjectWithArray();
    Assert(!isJsArray == valueType.IsOptimizedTypedArray());

    const bool noForwardImplicitCallUses = currentBlock->noImplicitCallUses->IsEmpty();
    bool changeArray = isJsArray && !opnd->IsValueTypeFixed() && noForwardImplicitCallUses;
    bool changeNativeArray =
        isJsArray &&
        !opnd->IsValueTypeFixed() &&
        !valueType.HasVarElements() &&
        currentBlock->noImplicitCallNativeArrayUses->IsEmpty();
    bool changeNoMissingValues =
        isJsArray &&
        !opnd->IsValueTypeFixed() &&
        valueType.HasNoMissingValues() &&
        currentBlock->noImplicitCallNoMissingValuesUses->IsEmpty();
    const bool noForwardJsArrayHeadSegmentSymUses = currentBlock->noImplicitCallJsArrayHeadSegmentSymUses->IsEmpty();
    bool removeHeadSegmentSym = isJsArray && arrayOpnd && arrayOpnd->HeadSegmentSym() && noForwardJsArrayHeadSegmentSymUses;
    bool removeHeadSegmentLengthSym =
        arrayOpnd &&
        arrayOpnd->HeadSegmentLengthSym() &&
        (isJsArray ? noForwardJsArrayHeadSegmentSymUses : noForwardImplicitCallUses);
    Assert(!isJsArray || !arrayOpnd || !arrayOpnd->LengthSym() || valueType.IsArray());
    bool removeLengthSym =
        isJsArray &&
        arrayOpnd &&
        arrayOpnd->LengthSym() &&
        currentBlock->noImplicitCallArrayLengthSymUses->IsEmpty();
    if(!(changeArray || changeNoMissingValues || changeNativeArray || removeHeadSegmentSym || removeHeadSegmentLengthSym))
    {
        return;
    }

    // We have a definitely-array value type for the base, but either implicit calls are not currently being disabled for
    // legally using the value type as a definite array, or we are not currently bailing out upon creating a missing value
    // for legally using the value type as a definite array with no missing values.

    // For source opnds, ensure that a NoImplicitCallUses immediately precedes this instruction. Otherwise, convert the value
    // type to an appropriate version so that the lowerer doesn't incorrectly treat it as it says.
    if(opnd != opndOwnerInstr->GetDst())
    {
        if(isJsArray)
        {
            IR::Opnd *const checkedSrc =
                FindNoImplicitCallUse(
                    instr,
                    opnd,
                    [&](IR::Opnd *const checkedSrc) -> bool
                    {
                        const ValueType checkedSrcValueType(checkedSrc->GetValueType());
                        return
                            checkedSrcValueType.IsLikelyObject() &&
                            checkedSrcValueType.GetObjectType() == valueType.GetObjectType();
                    });
            if(checkedSrc)
            {
                // Implicit calls will be disabled to the point immediately before this instruction
                changeArray = false;

                const ValueType checkedSrcValueType(checkedSrc->GetValueType());
                if(changeNativeArray &&
                    !checkedSrcValueType.HasVarElements() &&
                    checkedSrcValueType.HasIntElements() == valueType.HasIntElements())
                {
                    // If necessary, instructions before this will bail out on converting a native array
                    changeNativeArray = false;
                }

                if(changeNoMissingValues && checkedSrcValueType.HasNoMissingValues())
                {
                    // If necessary, instructions before this will bail out on creating a missing value
                    changeNoMissingValues = false;
                }

                if((removeHeadSegmentSym || removeHeadSegmentLengthSym || removeLengthSym) && checkedSrc->IsRegOpnd())
                {
                    IR::RegOpnd *const checkedRegSrc = checkedSrc->AsRegOpnd();
                    if(checkedRegSrc->IsArrayRegOpnd())
                    {
                        IR::ArrayRegOpnd *const checkedArraySrc = checkedSrc->AsRegOpnd()->AsArrayRegOpnd();
                        if(removeHeadSegmentSym && checkedArraySrc->HeadSegmentSym() == arrayOpnd->HeadSegmentSym())
                        {
                            // If necessary, instructions before this will bail out upon invalidating head segment sym
                            removeHeadSegmentSym = false;
                        }
                        if(removeHeadSegmentLengthSym &&
                            checkedArraySrc->HeadSegmentLengthSym() == arrayOpnd->HeadSegmentLengthSym())
                        {
                            // If necessary, instructions before this will bail out upon invalidating head segment length sym
                            removeHeadSegmentLengthSym = false;
                        }
                        if(removeLengthSym && checkedArraySrc->LengthSym() == arrayOpnd->LengthSym())
                        {
                            // If necessary, instructions before this will bail out upon invalidating a length sym
                            removeLengthSym = false;
                        }
                    }
                }
            }
        }
        else
        {
            Assert(removeHeadSegmentLengthSym);

            // A typed array's head segment length may be zeroed when the typed array's buffer is transferred to a web worker,
            // so the head segment length sym use is included in a NoImplicitCallUses instruction. Since there are no forward
            // uses of any head segment length syms, to allow removing the extracted head segment length
            // load, the corresponding head segment length sym use in the NoImplicitCallUses instruction must also be
            // removed.
            IR::Opnd *const use =
                FindNoImplicitCallUse(
                    instr,
                    arrayOpnd->HeadSegmentLengthSym(),
                    [&](IR::Opnd *const checkedSrc) -> bool
                    {
                        return checkedSrc->AsRegOpnd()->m_sym == arrayOpnd->HeadSegmentLengthSym();
                    });
            if(use)
            {
                // Implicit calls will be disabled to the point immediately before this instruction
                removeHeadSegmentLengthSym = false;
            }
        }
    }

    if(changeArray || changeNativeArray)
    {
        if(arrayOpnd)
        {
            opnd = arrayOpnd->CopyAsRegOpnd(opndOwnerInstr->m_func);
            if (origOpnd->IsIndirOpnd())
            {
                origOpnd->AsIndirOpnd()->ReplaceBaseOpnd(opnd->AsRegOpnd());
            }
            else
            {
                opndOwnerInstr->Replace(arrayOpnd, opnd);
            }
            arrayOpnd = nullptr;
        }
        opnd->SetValueType(valueType.ToLikely());
    }
    else
    {
        if(changeNoMissingValues)
        {
            opnd->SetValueType(valueType.SetHasNoMissingValues(false));
        }
        if(removeHeadSegmentSym)
        {
            Assert(arrayOpnd);
            arrayOpnd->RemoveHeadSegmentSym();
        }
        if(removeHeadSegmentLengthSym)
        {
            Assert(arrayOpnd);
            arrayOpnd->RemoveHeadSegmentLengthSym();
        }
        if(removeLengthSym)
        {
            Assert(arrayOpnd);
            arrayOpnd->RemoveLengthSym();
        }
    }
}